

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O2

void createSimpleNeuralNetworkClassifierModel(Model *spec,char *inputName,char *outputName)

{
  ulong uVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *pAVar5;
  DictionaryFeatureType *this;
  NeuralNetworkClassifier *this_00;
  StringVector *this_01;
  NeuralNetworkLayer *pNVar6;
  InnerProductLayerParams *pIVar7;
  WeightParams *pWVar8;
  undefined8 *puVar9;
  int iVar10;
  bool bVar11;
  allocator<char> local_71;
  string probsName;
  string featureName;
  
  spec->specificationversion_ = 9;
  pMVar2 = CoreML::Specification::Model::_internal_mutable_description(spec);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->input_);
  uVar1 = (pFVar3->super_MessageLite)._internal_metadata_.ptr_;
  puVar9 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar9 = (undefined8 *)*puVar9;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar3->name_,inputName,puVar9);
  pFVar4 = CoreML::Specification::FeatureDescription::_internal_mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::_internal_mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar5,3);
  pFVar4 = CoreML::Specification::FeatureDescription::_internal_mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::_internal_mutable_multiarraytype(pFVar4);
  pAVar5->datatype_ = 0x20020;
  pMVar2 = CoreML::Specification::Model::_internal_mutable_description(spec);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->output_);
  uVar1 = (pFVar3->super_MessageLite)._internal_metadata_.ptr_;
  puVar9 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar9 = (undefined8 *)*puVar9;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar3->name_,outputName,puVar9);
  pFVar4 = CoreML::Specification::FeatureDescription::_internal_mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::_internal_mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar5,3);
  pFVar4 = CoreML::Specification::FeatureDescription::_internal_mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::_internal_mutable_multiarraytype(pFVar4);
  pAVar5->datatype_ = 0x20020;
  pMVar2 = CoreML::Specification::Model::_internal_mutable_description(spec);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->output_);
  uVar1 = (pFVar3->super_MessageLite)._internal_metadata_.ptr_;
  puVar9 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar9 = (undefined8 *)*puVar9;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar3->name_,"features",puVar9);
  pFVar4 = CoreML::Specification::FeatureDescription::_internal_mutable_type(pFVar3);
  CoreML::Specification::FeatureType::_internal_mutable_stringtype(pFVar4);
  pMVar2 = CoreML::Specification::Model::_internal_mutable_description(spec);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->output_);
  uVar1 = (pFVar3->super_MessageLite)._internal_metadata_.ptr_;
  puVar9 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar9 = (undefined8 *)*puVar9;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar3->name_,"probs",puVar9);
  pFVar4 = CoreML::Specification::FeatureDescription::_internal_mutable_type(pFVar3);
  CoreML::Specification::FeatureType::_internal_mutable_dictionarytype(pFVar4);
  pFVar4 = CoreML::Specification::FeatureDescription::_internal_mutable_type(pFVar3);
  this = CoreML::Specification::FeatureType::_internal_mutable_dictionarytype(pFVar4);
  CoreML::Specification::DictionaryFeatureType::_internal_mutable_stringkeytype(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&featureName,"features",(allocator<char> *)&probsName);
  pMVar2 = CoreML::Specification::Model::_internal_mutable_description(spec);
  uVar1 = (pMVar2->super_MessageLite)._internal_metadata_.ptr_;
  puVar9 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar9 = (undefined8 *)*puVar9;
  }
  google::protobuf::internal::ArenaStringPtr::Set
            (&pMVar2->predictedfeaturename_,&featureName,puVar9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&probsName,"probs",&local_71);
  pMVar2 = CoreML::Specification::Model::_internal_mutable_description(spec);
  uVar1 = (pMVar2->super_MessageLite)._internal_metadata_.ptr_;
  puVar9 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar9 = (undefined8 *)*puVar9;
  }
  google::protobuf::internal::ArenaStringPtr::Set
            (&pMVar2->predictedprobabilitiesname_,&probsName,puVar9);
  this_00 = CoreML::Specification::Model::_internal_mutable_neuralnetworkclassifier(spec);
  this_01 = CoreML::Specification::NeuralNetworkClassifier::_internal_mutable_stringclasslabels
                      (this_00);
  CoreML::Specification::StringVector::add_vector(this_01,"label1");
  pNVar6 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                     (&this_00->layers_);
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar6,inputName);
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar6,"middle");
  pIVar7 = CoreML::Specification::NeuralNetworkLayer::_internal_mutable_innerproduct(pNVar6);
  pIVar7->hasbias_ = false;
  pIVar7->inputchannels_ = 3;
  pIVar7->outputchannels_ = 3;
  iVar10 = 9;
  while (bVar11 = iVar10 != 0, iVar10 = iVar10 + -1, bVar11) {
    pWVar8 = CoreML::Specification::InnerProductLayerParams::_internal_mutable_weights(pIVar7);
    CoreML::Specification::WeightParams::_internal_add_floatvalue(pWVar8,1.0);
  }
  pNVar6 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                     (&this_00->layers_);
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar6,"middle");
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar6,outputName);
  pIVar7 = CoreML::Specification::NeuralNetworkLayer::_internal_mutable_innerproduct(pNVar6);
  pIVar7->hasbias_ = false;
  pIVar7->inputchannels_ = 3;
  pIVar7->outputchannels_ = 3;
  iVar10 = 9;
  while (bVar11 = iVar10 != 0, iVar10 = iVar10 + -1, bVar11) {
    pWVar8 = CoreML::Specification::InnerProductLayerParams::_internal_mutable_weights(pIVar7);
    CoreML::Specification::WeightParams::_internal_add_floatvalue(pWVar8,1.0);
  }
  std::__cxx11::string::~string((string *)&probsName);
  std::__cxx11::string::~string((string *)&featureName);
  return;
}

Assistant:

void createSimpleNeuralNetworkClassifierModel(Specification::Model *spec, const char *inputName, const char *outputName) {
    
    spec->set_specificationversion(MLMODEL_SPECIFICATION_VERSION);

    auto *topIn = spec->mutable_description()->add_input();
    topIn->set_name(inputName);
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(3);
    topIn->mutable_type()->mutable_multiarraytype()->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_INT32);

    auto *out = spec->mutable_description()->add_output();
    out->set_name(outputName);
    auto *outshape = out->mutable_type()->mutable_multiarraytype();
    outshape->add_shape(3);
    out->mutable_type()->mutable_multiarraytype()->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_INT32);

    auto *out2 = spec->mutable_description()->add_output();
    out2->set_name("features");
    out2->mutable_type()->mutable_stringtype();

    auto *out3 = spec->mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_dictionarytype();
    out3->mutable_type()->mutable_dictionarytype()->mutable_stringkeytype();

    std::string featureName = "features";
    spec->mutable_description()->set_predictedfeaturename(featureName);
    std::string probsName = "probs";
    spec->mutable_description()->set_predictedprobabilitiesname(probsName);

    const auto nn = spec->mutable_neuralnetworkclassifier();
    auto labels = nn->mutable_stringclasslabels();
    labels->add_vector("label1");

    Specification::NeuralNetworkLayer *innerProductLayer = nn->add_layers();
    innerProductLayer->add_input(inputName);
    innerProductLayer->add_output("middle");
    Specification::InnerProductLayerParams *innerProductParams = innerProductLayer->mutable_innerproduct();
    innerProductParams->set_hasbias(false);
    innerProductParams->set_inputchannels(3);
    innerProductParams->set_outputchannels(3);
    for (int i = 0; i < 9; i++) {
        innerProductParams->mutable_weights()->add_floatvalue(1.0);
    }

    Specification::NeuralNetworkLayer *innerProductLayer2 = nn->add_layers();
    innerProductLayer2->add_input("middle");
    innerProductLayer2->add_output(outputName);
    Specification::InnerProductLayerParams *innerProductParams2 = innerProductLayer2->mutable_innerproduct();
    innerProductParams2->set_hasbias(false);
    innerProductParams2->set_inputchannels(3);
    innerProductParams2->set_outputchannels(3);
    for (int i = 0; i < 9; i++) {
        innerProductParams2->mutable_weights()->add_floatvalue(1.0);
    }
}